

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

void qpdf_force_pdf_version_and_extension(qpdf_data qpdf,char *version,int extension_level)

{
  char *__s;
  element_type *this;
  allocator<char> local_41;
  string local_40;
  int local_1c;
  char *pcStack_18;
  int extension_level_local;
  char *version_local;
  qpdf_data qpdf_local;
  
  local_1c = extension_level;
  pcStack_18 = version;
  version_local = (char *)qpdf;
  QTC::TC("qpdf","qpdf-c called qpdf_force_pdf_version",0);
  this = std::__shared_ptr_access<QPDFWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                   ((__shared_ptr_access<QPDFWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    (version_local + 0x10));
  __s = pcStack_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,__s,&local_41);
  QPDFWriter::forcePDFVersion(this,&local_40,local_1c);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

void
qpdf_force_pdf_version_and_extension(qpdf_data qpdf, char const* version, int extension_level)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_force_pdf_version");
    qpdf->qpdf_writer->forcePDFVersion(version, extension_level);
}